

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  CallFlags CVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  DynamicObject *obj;
  RecyclableObject *pRVar7;
  CallInfo local_c8;
  RecyclableObject *local_b8;
  CallInfo local_98;
  RecyclableObject *result;
  Var arg;
  RecyclableObject *local_78;
  Var newTarget;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  library = (JavascriptLibrary *)RecyclableObject::GetScriptContext(function);
  newTarget = ScriptContext::GetLibrary((ScriptContext *)library);
  bVar2 = Arguments::HasArg((Arguments *)&scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x11,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_78 = (RecyclableObject *)Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)&arg,(Arguments *)&scriptContext);
  bVar2 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&arg);
  if ((bVar2) && (local_78 != function)) {
    pRVar7 = VarTo<Js::RecyclableObject>(local_78);
    obj = JavascriptLibrary::CreateObject((JavascriptLibrary *)newTarget,true,0);
    callInfo_local =
         (CallInfo)
         Js::JavascriptOperators::OrdinaryCreateFromConstructor
                   (pRVar7,&obj->super_RecyclableObject,(DynamicObject *)0x0,
                    (ScriptContext *)library);
  }
  else {
    if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
      local_b8 = JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)newTarget);
    }
    else {
      local_b8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    result = local_b8;
    if (local_b8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(local_b8);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_b8);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(local_b8);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(pRVar7);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    switch(local_18) {
    case TypeIds_Undefined:
    case TypeIds_Null:
      CVar4 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                            (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                             CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                            CallFlags_New),CallFlags_NotUsed);
      if (CVar4 == CallFlags_None) {
        local_c8 = (CallInfo)JavascriptLibrary::CreateObject((JavascriptLibrary *)newTarget,true,0);
      }
      else {
        local_c8 = (CallInfo)result;
      }
      callInfo_local = local_c8;
      break;
    default:
      local_98 = (CallInfo)0x0;
      JavascriptConversion::ToObject(result,(ScriptContext *)library,(RecyclableObject **)&local_98)
      ;
      if (local_98 == (CallInfo)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x3c,"(result)","result");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      callInfo_local = local_98;
      break;
    case TypeIds_Function:
    case TypeIds_Object:
    case TypeIds_Array:
    case TypeIds_ArrayLastWithES5:
    case TypeIds_Date:
    case TypeIds_RegEx:
    case TypeIds_Error:
    case TypeIds_BooleanObject:
    case TypeIds_NumberObject:
    case TypeIds_StringObject:
    case TypeIds_SIMDObject:
    case TypeIds_Arguments:
    case TypeIds_SymbolObject:
    case TypeIds_ActivationObject:
      callInfo_local = (CallInfo)result;
    }
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptObject::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    if (JavascriptOperators::GetAndAssertIsConstructorSuperCall(args) &&
        newTarget != function)
    {
        return JavascriptOperators::OrdinaryCreateFromConstructor(
            VarTo<RecyclableObject>(newTarget),
            library->CreateObject(true),
            nullptr,
            scriptContext);
    }

    Var arg = args.Info.Count > 1 ? args[1] : library->GetUndefined();
    switch (JavascriptOperators::GetTypeId(arg))
    {
        case TypeIds_Undefined:
        case TypeIds_Null:
            // Null and undefined result in a new object
            return (callInfo.Flags & CallFlags_NotUsed)
                ? arg
                : library->CreateObject(true);

        case TypeIds_StringObject:
        case TypeIds_Function:
        case TypeIds_Array:
        case TypeIds_ES5Array:
        case TypeIds_RegEx:
        case TypeIds_NumberObject:
        case TypeIds_SIMDObject:
        case TypeIds_Date:
        case TypeIds_BooleanObject:
        case TypeIds_Error:
        case TypeIds_Object:
        case TypeIds_Arguments:
        case TypeIds_ActivationObject:
        case TypeIds_SymbolObject:
            // Since we know this is an object, we can skip ToObject
            return arg;
    }

    RecyclableObject* result = nullptr;
    JavascriptConversion::ToObject(arg, scriptContext, &result);
    Assert(result);
    return result;
}